

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

bool tryParseURL(string *fname,vector<Tle,_std::allocator<Tle>_> *tles)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  FILE *__stream;
  ostream *poVar5;
  iterator iVar6;
  move_iterator<__gnu_cxx::__normal_iterator<Tle_*,_std::vector<Tle,_std::allocator<Tle>_>_>_>
  __first;
  move_iterator<__gnu_cxx::__normal_iterator<Tle_*,_std::vector<Tle,_std::allocator<Tle>_>_>_>
  __last;
  __normal_iterator<Tle_*,_std::vector<Tle,_std::allocator<Tle>_>_> local_60;
  const_iterator local_58;
  undefined1 local_50 [8];
  vector<Tle,_std::allocator<Tle>_> newTLEs;
  bool ok;
  FILE *fp;
  CURL *crl;
  vector<Tle,_std::allocator<Tle>_> *tles_local;
  string *fname_local;
  
  lVar2 = curl_easy_init();
  if (lVar2 == 0) {
    fname_local._7_1_ = false;
  }
  else {
    uVar3 = std::__cxx11::string::c_str();
    iVar1 = curl_easy_setopt(lVar2,0x2712,uVar3);
    if (iVar1 == 0) {
      lVar4 = std::__cxx11::string::find((char *)fname,0x127734);
      if (lVar4 == -1) {
        fname_local._7_1_ = false;
      }
      else {
        __stream = tmpfile();
        if (__stream == (FILE *)0x0) {
          fname_local._7_1_ = false;
        }
        else {
          iVar1 = curl_easy_setopt(lVar2,0x2711,__stream);
          if (iVar1 == 0) {
            poVar5 = std::operator<<((ostream *)&std::cout,"[+] Downloading contents from ");
            poVar5 = std::operator<<(poVar5,(string *)fname);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            iVar1 = curl_easy_perform(lVar2);
            newTLEs.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._7_1_ = iVar1 == 0;
            curl_easy_cleanup(lVar2);
            rewind(__stream);
            readTLEs((vector<Tle,_std::allocator<Tle>_> *)local_50,fname,(FILE *)__stream);
            local_60._M_current = (Tle *)std::vector<Tle,_std::allocator<Tle>_>::end(tles);
            __gnu_cxx::__normal_iterator<Tle_const*,std::vector<Tle,std::allocator<Tle>>>::
            __normal_iterator<Tle*>
                      ((__normal_iterator<Tle_const*,std::vector<Tle,std::allocator<Tle>>> *)
                       &local_58,&local_60);
            iVar6 = std::vector<Tle,_std::allocator<Tle>_>::begin
                              ((vector<Tle,_std::allocator<Tle>_> *)local_50);
            __first = std::
                      make_move_iterator<__gnu_cxx::__normal_iterator<Tle*,std::vector<Tle,std::allocator<Tle>>>>
                                ((__normal_iterator<Tle_*,_std::vector<Tle,_std::allocator<Tle>_>_>)
                                 iVar6._M_current);
            iVar6 = std::vector<Tle,_std::allocator<Tle>_>::end
                              ((vector<Tle,_std::allocator<Tle>_> *)local_50);
            __last = std::
                     make_move_iterator<__gnu_cxx::__normal_iterator<Tle*,std::vector<Tle,std::allocator<Tle>>>>
                               ((__normal_iterator<Tle_*,_std::vector<Tle,_std::allocator<Tle>_>_>)
                                iVar6._M_current);
            std::vector<Tle,std::allocator<Tle>>::
            insert<std::move_iterator<__gnu_cxx::__normal_iterator<Tle*,std::vector<Tle,std::allocator<Tle>>>>,void>
                      ((vector<Tle,std::allocator<Tle>> *)tles,local_58,__first,__last);
            fclose(__stream);
            fname_local._7_1_ =
                 (bool)(newTLEs.super__Vector_base<Tle,_std::allocator<Tle>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
            std::vector<Tle,_std::allocator<Tle>_>::~vector
                      ((vector<Tle,_std::allocator<Tle>_> *)local_50);
          }
          else {
            fclose(__stream);
            curl_easy_cleanup(lVar2);
            fname_local._7_1_ = false;
          }
        }
      }
    }
    else {
      fname_local._7_1_ = false;
    }
  }
  return fname_local._7_1_;
}

Assistant:

static bool tryParseURL(const std::string &fname, std::vector<Tle> &tles) {
  CURL *crl = curl_easy_init();
  if (!crl)
    return false;
  if (curl_easy_setopt(crl, CURLOPT_URL, fname.c_str()))
    return false;

  // Ignore any "URLs" that do not have a protocol delimiter.
  if (fname.find("://") == std::string::npos)
    return false;

  // Prepare to download the TLE data into a temp file.
  FILE *fp = tmpfile();
  if (!fp)
    return false;
  if (curl_easy_setopt(crl, CURLOPT_WRITEDATA, fp)) {
    fclose(fp);
    curl_easy_cleanup(crl);
    return false;
  }

  // Download the data.
  std::cout << "[+] Downloading contents from " << fname << std::endl;
  bool ok = curl_easy_perform(crl) == CURLE_OK;
  curl_easy_cleanup(crl);

  // Read the new TLEs and add them to 'tles'.
  rewind(fp);
  auto newTLEs = readTLEs(fname, fp);
  tles.insert(tles.end(), std::make_move_iterator(newTLEs.begin()),
              std::make_move_iterator(newTLEs.end()));
  fclose(fp);
  return ok;
}